

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamIGA.cpp
# Opt level: O2

void __thiscall chrono::fea::ChElementBeamIGA::ChElementBeamIGA(ChElementBeamIGA *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [64];
  
  auVar1 = ZEXT816(0) << 0x40;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.super_ChKblock._vptr_ChKblock =
       (_func_int **)&PTR__ChKblockGeneric_01186748;
  auVar2 = ZEXT1632(auVar1);
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.K =
       (ChMatrixDynamic<double>)auVar2._0_24_;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar2._24_8_;
  *(undefined1 (*) [32])
   &(this->super_ChElementBeam).super_ChElementGeneric.Kmatr.K.
    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = auVar2;
  (this->super_ChElementBeam).mass = 0.0;
  (this->super_ChElementBeam).length = 0.0;
  (this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase =
       (_func_int **)0x117e9e8;
  this->super_ChLoadableU = (ChLoadableU)0x117ebc0;
  this->super_ChLoadableUVW = (ChLoadableUVW)0x117eca8;
  (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  this->nodes = (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                 )SUB3224(ZEXT1632(auVar1),0);
  (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)SUB328(ZEXT1632(auVar1),0x18);
  auVar3 = ZEXT464(0) << 0x40;
  this->Jacobian_s = (vector<double,_std::allocator<double>_>)auVar3._0_24_;
  this->Jacobian_b = (vector<double,_std::allocator<double>_>)auVar3._24_24_;
  (this->strain_e_0).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar3._48_8_;
  (this->strain_e_0).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar3._56_8_;
  *(undefined1 (*) [64])
   &(this->strain_e_0).
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = auVar3;
  *(undefined1 (*) [64])
   &(this->stress_m).
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_finish = auVar3;
  this->plastic_data_old =
       (vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
        )auVar3._0_24_;
  this->plastic_data =
       (vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
        )auVar3._24_24_;
  this->section = (shared_ptr<chrono::fea::ChBeamSectionCosserat>)auVar3._48_16_;
  this->order = 3;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::resize(&this->nodes,4);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,8);
  this->int_order_s = 1;
  this->int_order_b = 1;
  return;
}

Assistant:

ChElementBeamIGA::ChElementBeamIGA() {
    order = 3;
    nodes.resize(4);  // controllare se ordine = -> 2 nodi, 2 control points, o di pi?
    knots.resize(8);
    int_order_s = 1;
    int_order_b = 1;
}